

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O1

void __thiscall CTcSymObjBase::~CTcSymObjBase(CTcSymObjBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CTcSymObjBase(const char *str, size_t len, int copy, ulong obj_id,
                  int is_extern, tc_metaclass_t meta,
                  class CTcDictEntry *dict)
        : CTcSymbol(str, len, copy, TC_SYM_OBJ)
    {
        /* store the object ID */
        obj_id_ = obj_id;

        /* note whether it's external */
        is_extern_ = is_extern;

        /* we're not yet referenced */
        ref_ = FALSE;

        /* we don't have a stream offset yet */
        stream_ofs_ = 0xffffffff;

        /* we're don't 'modify' or 'replace' an external object */
        ext_modify_ = ext_replace_ = FALSE;

        /* I haven't been modified yet */
        modified_ = FALSE;

        /* presume we won't modify another object */
        mod_base_sym_ = 0;

        /* presume we won't be modified by another object */
        modifying_obj_.sym_ = 0;

        /* no parse tree yet */
        obj_stm_ = 0;

        /* no self-reference fixups yet */
        fixups_ = 0;

        /* no deleted properties yet */
        first_del_prop_ = 0;

        /* set the metaclass */
        metaclass_ = meta;

        /* set the dictionary */
        dict_ = dict;

        /* not yet written to object file */
        written_to_obj_ = FALSE;
        counted_in_obj_ = FALSE;

        /* no object file index yet */
        obj_file_idx_ = 0;

        /* no vocabulary yet */
        vocab_ = 0;

        /* no superclasses in our list yet */
        sc_ = 0;

        /* no superclass names in our list yet */
        sc_name_head_ = 0;
        sc_name_tail_ = 0;

        /* presume we're not a class */
        is_class_ = FALSE;

        /* we haven't built our inherited vocabulary list yet */
        vocab_inherited_ = FALSE;

        /* presume we're fully nonymous */
        anon_ = FALSE;

        /* assume we will have no metaclass-specific extra data object */
        meta_extra_ = 0;

        /* we're not yet explicitly based on the root object class */
        sc_is_root_ = FALSE;

        /* no templates for this class yet */
        template_head_ = template_tail_ = 0;

        /* we don't have a private grammar rule list yet */
        grammar_entry_ = 0;

        /* presume it's not transient */
        transient_ = FALSE;
    }